

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O3

bool __thiscall QFileSystemEntry::isRelative(QFileSystemEntry *this)

{
  bool bVar1;
  
  resolveFilePath(this);
  if ((this->m_filePath).d.size == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = *(this->m_filePath).d.ptr != L'/';
  }
  return bVar1;
}

Assistant:

bool QFileSystemEntry::isRelative() const
{
    return !isAbsolute();
}